

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O2

void __thiscall helics::tcp::TcpComms::queue_tx_function(TcpComms *this)

{
  TcpConnection *this_00;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  string *in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ActionMessage *command;
  TcpConnection *pTVar6;
  string *in_R8;
  string_view message;
  route_id rid;
  string interface;
  string port;
  string *local_268;
  string *local_260;
  pointer brokerConnection;
  LoopHandle contextLoop;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  string newroute;
  undefined1 local_1f8 [16];
  _Head_base<0UL,_asio::io_context_*,_false> local_1e8;
  _Head_base<0UL,_asio::io_context::work_*,_false> local_1e0;
  ActionMessage m;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  routes;
  undefined1 local_e8 [48];
  __native_type _Stack_b8;
  byte local_90 [8];
  __native_type _Stack_88;
  size_t local_60;
  byte *local_58;
  undefined8 local_50;
  pointer pbStack_48;
  _Any_data local_40;
  
  m._0_8_ = &m.dest_id;
  m.source_id.gid = 0;
  m.source_handle.hid = 0;
  m.dest_id.gid._0_1_ = 0;
  gmlc::networking::AsioContextManager::getContextPointer((AsioContextManager *)&ioctx,(string *)&m)
  ;
  std::__cxx11::string::~string((string *)&m);
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)local_1f8,&this->encryption_config,true);
  }
  else {
    local_1f8._0_8_ = 0;
    local_1f8._8_8_ = 0;
    local_1e8._M_head_impl = (io_context *)0x0;
  }
  gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)&contextLoop);
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &routes._M_t._M_impl.super__Rb_tree_header._M_header;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  brokerConnection.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  brokerConnection.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      iVar3 = getDefaultPort(6);
      LOCK();
      (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar3;
      UNLOCK();
      ActionMessage::ActionMessage(&m,cmd_protocol);
      m.messageID = 0x5ab;
      m.dest_handle.hid =
           (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &this->rxMessageQueue,&m);
      ActionMessage::~ActionMessage(&m);
    }
  }
  else {
    bVar2 = establishBrokerConnection(this,&ioctx,&brokerConnection);
    if (!bVar2) {
      ActionMessage::ActionMessage(&m,cmd_protocol);
      m.messageID = 0x16570bf;
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &this->rxMessageQueue,&m);
      ActionMessage::~ActionMessage(&m);
      goto LAB_0026ab8f;
    }
  }
  CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
  local_1e0._M_head_impl = (work *)&this->rxMessageQueue;
  do {
    rid.rid = -0x4d3263e0;
    local_e8._0_4_ = cmd_ignore;
    local_e8._4_4_ = 0;
    local_e8._8_8_ = (__pthread_internal_list *)0x9aac0f0000000000;
    local_e8._16_8_ = (__pthread_internal_list *)0x9aac0f0000000000;
    _Stack_88.__data.__list.__prev = (__pthread_internal_list *)0x0;
    _Stack_88.__data.__list.__next = (__pthread_internal_list *)0x0;
    _Stack_88._8_8_ = 0;
    _Stack_88._16_8_ = 0;
    local_90[0] = 0;
    local_90[1] = 0;
    local_90[2] = 0;
    local_90[3] = 0;
    local_90[4] = 0;
    local_90[5] = 0;
    local_90[6] = 0;
    local_90[7] = 0;
    _Stack_88.__align = 0;
    _Stack_b8.__data.__list.__prev = (__pthread_internal_list *)0x0;
    _Stack_b8.__data.__list.__next = (__pthread_internal_list *)0x0;
    _Stack_b8._8_8_ = 0;
    _Stack_b8._16_8_ = 0;
    local_e8._40_8_ = 0;
    _Stack_b8.__align = 0;
    local_e8._24_2_ = 0;
    local_e8._26_2_ = 0;
    local_e8._28_4_ = 0;
    local_e8._32_8_ = 0;
    local_60 = 0x40;
    local_58 = (byte *)((long)&_Stack_b8 + 0x10);
    local_40._M_unused._M_object = (pointer)0x0;
    local_40._8_8_ = (pointer)0x0;
    local_50._0_1_ = false;
    local_50._1_1_ = false;
    local_50._2_1_ = false;
    local_50._3_1_ = '\0';
    local_50._4_4_ = 0;
    pbStack_48 = (pointer)0x0;
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::pop((pair<helics::route_id,_helics::ActionMessage> *)&m,
          &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue);
    newroute._M_string_length = (size_type)&rid;
    pTVar6 = (TcpConnection *)&m;
    newroute._M_dataplus._M_p = (pointer)local_e8;
    std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
              ((tuple<helics::route_id&,helics::ActionMessage&> *)&newroute,
               (pair<helics::route_id,_helics::ActionMessage> *)&m);
    ActionMessage::~ActionMessage((ActionMessage *)&m.source_id);
    peVar1 = brokerConnection.
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((((local_e8._0_4_ == cmd_protocol_priority) || (local_e8._0_4_ == cmd_protocol_big)) ||
        (local_e8._0_4_ == cmd_protocol)) && (rid.rid == -1)) {
      if (local_e8._4_4_ == 0xe9) {
        m._0_8_ = _Stack_88.__data.__list.__next;
        m._8_8_ = local_58;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&newroute,(basic_string_view<char,_std::char_traits<char>_> *)&m,
                   (allocator<char> *)&interface);
        interface._M_dataplus._M_p = (pointer)&interface.field_2;
        interface._M_string_length = 0;
        interface.field_2._M_local_buf[0] = '\0';
        port._M_dataplus._M_p = (pointer)&port.field_2;
        port._M_string_length = 0;
        port.field_2._M_local_buf[0] = '\0';
        gmlc::networking::extractInterfaceAndPortString
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&m,&newroute);
        in_R8 = &port;
        in_RCX = &interface;
        local_268 = in_R8;
        local_260 = in_RCX;
        std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                  ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_268,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&m);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m);
        gmlc::networking::TcpConnection::create
                  ((TcpConnection *)&m,(SocketFactory *)local_1f8,
                   ((ioctx.
                     super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->ictx)._M_t.
                   super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                   .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,in_RCX,in_R8,
                   0x27d0);
        local_268 = (string *)CONCAT44(local_268._4_4_,local_e8._20_4_);
        std::
        _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
        ::_M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                  ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                    *)&routes,(route_id *)&local_268,
                   (shared_ptr<gmlc::networking::TcpConnection> *)&m);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m.source_id);
        std::__cxx11::string::~string((string *)&port);
        std::__cxx11::string::~string((string *)&interface);
LAB_0026a62e:
        pTVar6 = (TcpConnection *)&newroute;
        goto LAB_0026a663;
      }
      if (local_e8._4_4_ == 0xf4) {
        m.messageAction = local_e8._20_4_;
        std::
        _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
        ::erase(&routes._M_t,(key_type *)&m);
        goto LAB_0026a668;
      }
      if (local_e8._4_4_ == 0x9db) break;
LAB_0026a4af:
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 local_1e0._M_head_impl,(ActionMessage *)local_e8);
    }
    else {
      if (rid.rid == -1) goto LAB_0026a4af;
      iVar3 = (int)(TcpConnection *)&m;
      pTVar6 = (TcpConnection *)&m;
      if (rid.rid == 0) {
        if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
          ActionMessage::packetize_abi_cxx11_((string *)&m,(ActionMessage *)local_e8);
          gmlc::networking::TcpConnection::send(peVar1,iVar3,__buf,(size_t)in_RCX,(int)in_R8);
          goto LAB_0026a663;
        }
      }
      else {
        iVar4 = std::
                _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                ::find(&routes._M_t,&rid);
        peVar1 = brokerConnection.
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        in_RCX = (string *)&routes._M_t._M_impl.super__Rb_tree_header;
        if (iVar4._M_node == (_Base_ptr)in_RCX) {
          if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
            bVar2 = isDisconnectCommand((ActionMessage *)local_e8);
            if (!bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&newroute,"(tcp) unknown message destination message dropped ",
                         (allocator<char> *)&port);
              prettyPrintString_abi_cxx11_(&interface,(helics *)local_e8,command);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m
                             ,&newroute,&interface);
              message._M_str = (char *)m._0_8_;
              message._M_len._0_4_ = m.source_id.gid;
              message._M_len._4_4_ = m.source_handle.hid;
              CommsInterface::logWarning((CommsInterface *)this,message);
              std::__cxx11::string::~string((string *)&m);
              std::__cxx11::string::~string((string *)&interface);
              goto LAB_0026a62e;
            }
            goto LAB_0026a668;
          }
          ActionMessage::packetize_abi_cxx11_((string *)&m,(ActionMessage *)local_e8);
          gmlc::networking::TcpConnection::send(peVar1,iVar3,__buf_01,(size_t)in_RCX,(int)in_R8);
        }
        else {
          this_00 = (TcpConnection *)iVar4._M_node[1]._M_parent;
          ActionMessage::packetize_abi_cxx11_((string *)&m,(ActionMessage *)local_e8);
          gmlc::networking::TcpConnection::send(this_00,iVar3,__buf_00,(size_t)in_RCX,(int)in_R8);
        }
LAB_0026a663:
        std::__cxx11::string::~string((string *)pTVar6);
      }
    }
LAB_0026a668:
    ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  } while( true );
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  for (p_Var5 = routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &routes._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    gmlc::networking::TcpConnection::close((TcpConnection *)p_Var5[1]._M_parent,(int)pTVar6);
  }
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::clear(&routes._M_t);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
    closeReceiver(this);
  }
  CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
LAB_0026ab8f:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~_Rb_tree(&routes._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&brokerConnection.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
  ::~unique_ptr(&contextLoop);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ioctx.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void TcpComms::queue_tx_function()
{
    // std::vector<char> buffer;
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto contextLoop = ioctx->startContextLoop();
    TcpConnection::pointer brokerConnection;

    std::map<route_id, TcpConnection::pointer> routes;  // for all the other possible routes
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (!establishBrokerConnection(ioctx, brokerConnection)) {
            ActionMessage m(CMD_PROTOCOL);
            m.messageID = CLOSE_RECEIVER;
            rxMessageQueue.push(m);
            return;
        }
    } else {
        if (PortNumber < 0) {
            PortNumber = getDefaultBrokerPort();
            ActionMessage m(CMD_PROTOCOL);
            m.messageID = PORT_DEFINITIONS;
            m.setExtraData(PortNumber);
            rxMessageQueue.push(m);
        }
    }
    setTxStatus(ConnectionStatus::CONNECTED);

    //  std::vector<ActionMessage> txlist;
    bool processing{true};
    while (processing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                switch (cmd.messageID) {
                    case NEW_ROUTE: {
                        std::string newroute(cmd.payload.to_string());

                        try {
                            std::string interface;
                            std::string port;
                            std::tie(interface, port) =
                                gmlc::networking::extractInterfaceAndPortString(newroute);
                            auto new_connect =
                                TcpConnection::create(sf, ioctx->getBaseContext(), interface, port);

                            routes.emplace(route_id{cmd.getExtraData()}, std::move(new_connect));
                        }
                        catch (std::exception& e) {
                            logWarning(std::string("unable to create route ") + newroute +
                                       "::" + e.what());
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        rxMessageQueue.push(cmd);
                        processed = true;
                        break;
                    case DISCONNECT:
                        processing = false;
                        processed = true;
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if (hasBroker) {
                try {
                    brokerConnection->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("broker send 0 ") +
                                     actionMessageType(cmd.action()) + ':' + se.what());
                        }
                    }
                }

                // if (error)
                {
                    //     std::cerr << "transmit failure to broker " << error.message() <<
                    //     '\n';
                }
            }
        } else if (rid == control_route) {  // send to rx thread loop
            rxMessageQueue.push(cmd);
        } else {
            //  txlist.push_back(cmd);
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                try {
                    rt_find->second->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("rt send ") + std::to_string(rid.baseValue()) +
                                     "::" + se.what());
                        }
                    }
                }
            } else {
                if (hasBroker) {
                    try {
                        brokerConnection->send(cmd.packetize());
                    }
                    catch (const std::system_error& se) {
                        if (se.code() != asio::error::connection_aborted) {
                            if (!isDisconnectCommand(cmd)) {
                                logError(std::string("broker send") +
                                         std::to_string(rid.baseValue()) + " ::" + se.what());
                            }
                        }
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(
                            std::string("(tcp) unknown message destination message dropped ") +
                            prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    for (auto& rt : routes) {
        rt.second->close();
    }
    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        closeReceiver();
    }
    setTxStatus(ConnectionStatus::TERMINATED);
}